

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionQueue.cpp
# Opt level: O0

ProcessStatus __thiscall
llbuild::basic::ExecutionQueue::executeProcess
          (ExecutionQueue *this,QueueJobContext *context,ArrayRef<llvm::StringRef> commandLine)

{
  ProcessStatus PVar1;
  anon_class_8_1_54a39810 local_e8;
  function<void_(llbuild::basic::ProcessResult)> local_e0;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> local_c0;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined6 uStack_96;
  StringRef local_90;
  undefined1 local_80;
  undefined1 uStack_7f;
  undefined6 uStack_7e;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> local_78;
  StringRef *local_68;
  size_type local_60;
  future<llbuild::basic::ProcessStatus> result;
  promise<llbuild::basic::ProcessStatus> p;
  QueueJobContext *context_local;
  ExecutionQueue *this_local;
  ArrayRef<llvm::StringRef> commandLine_local;
  
  std::promise<llbuild::basic::ProcessStatus>::promise
            ((promise<llbuild::basic::ProcessStatus> *)
             &result.super___basic_future<llbuild::basic::ProcessStatus>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<llbuild::basic::ProcessStatus>::get_future
            ((promise<llbuild::basic::ProcessStatus> *)&stack0xffffffffffffffa8);
  local_68 = commandLine.Data;
  local_60 = commandLine.Length;
  memset(&local_78,0,0x10);
  llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::ArrayRef(&local_78);
  local_98 = 1;
  uStack_97 = 0;
  memset(&local_90,0,0x10);
  llvm::StringRef::StringRef(&local_90);
  local_80 = 1;
  uStack_7f = 1;
  local_e8.p = (promise<llbuild::basic::ProcessStatus> *)
               &result.super___basic_future<llbuild::basic::ProcessStatus>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
  std::function<void(llbuild::basic::ProcessResult)>::
  function<llbuild::basic::ExecutionQueue::executeProcess(llbuild::basic::QueueJobContext*,llvm::ArrayRef<llvm::StringRef>)::__0,void>
            ((function<void(llbuild::basic::ProcessResult)> *)&local_e0,&local_e8);
  llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
            (&local_c0,&local_e0);
  (*this->_vptr_ExecutionQueue[4])
            (this,context,local_68,local_60,local_78.Data,local_78.Length,
             CONCAT62(uStack_96,CONCAT11(uStack_97,local_98)),local_90.Data,local_90.Length,
             CONCAT62(uStack_7e,CONCAT11(uStack_7f,local_80)),&local_c0,0);
  llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::~Optional(&local_c0);
  std::function<void_(llbuild::basic::ProcessResult)>::~function(&local_e0);
  PVar1 = std::future<llbuild::basic::ProcessStatus>::get
                    ((future<llbuild::basic::ProcessStatus> *)&stack0xffffffffffffffa8);
  std::future<llbuild::basic::ProcessStatus>::~future
            ((future<llbuild::basic::ProcessStatus> *)&stack0xffffffffffffffa8);
  std::promise<llbuild::basic::ProcessStatus>::~promise
            ((promise<llbuild::basic::ProcessStatus> *)
             &result.super___basic_future<llbuild::basic::ProcessStatus>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return PVar1;
}

Assistant:

ProcessStatus ExecutionQueue::executeProcess(QueueJobContext* context,
                                             ArrayRef<StringRef> commandLine) {
  std::promise<ProcessStatus> p;
  auto result = p.get_future();
  executeProcess(context, commandLine, {}, {true},
                 {[&p](ProcessResult result) mutable {
    p.set_value(result.status);
  }});
  return result.get();
}